

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O1

void LEARNER::multiline_learn_or_predict<false>
               (multi_learner *base,multi_ex *examples,uint64_t offset,uint32_t id)

{
  int iVar1;
  pointer ppeVar2;
  uint32_t uVar3;
  multi_learner *pmVar4;
  pointer ppeVar5;
  ulong uVar6;
  multi_ex *__range2;
  uint64_t *puVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> saved_offsets;
  allocator_type local_55;
  uint32_t local_54;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  multi_learner *local_38;
  
  local_54 = id;
  local_38 = base;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_50,
             (long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_55);
  ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar3 = local_54;
  pmVar4 = local_38;
  for (ppeVar5 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; local_54 = uVar3, local_38 = pmVar4,
      ppeVar5 != ppeVar2; ppeVar5 = ppeVar5 + 1) {
    puVar7 = &((*ppeVar5)->super_example_predict).ft_offset;
    if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_50,
                 (iterator)
                 local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,puVar7);
    }
    else {
      *local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = *puVar7;
      local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    *puVar7 = offset;
    uVar3 = local_54;
    pmVar4 = local_38;
  }
  ppeVar5 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar5 != ppeVar2) {
    iVar1 = *(int *)(pmVar4 + 0xe0);
    do {
      puVar7 = &((*ppeVar5)->super_example_predict).ft_offset;
      *puVar7 = *puVar7 + (ulong)(iVar1 * uVar3);
      ppeVar5 = ppeVar5 + 1;
    } while (ppeVar5 != ppeVar2);
  }
  (**(code **)(pmVar4 + 0x30))
            (*(undefined8 *)(pmVar4 + 0x18),*(undefined8 *)(pmVar4 + 0x20),examples);
  ppeVar5 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar5 != ppeVar2) {
    iVar1 = *(int *)(pmVar4 + 0xe0);
    do {
      puVar7 = &((*ppeVar5)->super_example_predict).ft_offset;
      *puVar7 = *puVar7 - (ulong)(uVar3 * iVar1);
      ppeVar5 = ppeVar5 + 1;
    } while (ppeVar5 != ppeVar2);
  }
  ppeVar5 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar5) {
    uVar6 = 0;
    do {
      (ppeVar5[uVar6]->super_example_predict).ft_offset =
           local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6];
      uVar6 = uVar6 + 1;
      ppeVar5 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(examples->
                                   super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar5 >> 3));
  }
  if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void multiline_learn_or_predict(multi_learner& base, multi_ex& examples, const uint64_t offset, const uint32_t id = 0)
{
  std::vector<uint64_t> saved_offsets(examples.size());
  for (auto ec : examples)
  {
    saved_offsets.push_back(ec->ft_offset);
    ec->ft_offset = offset;
  }

  if (is_learn)
    base.learn(examples, id);
  else
    base.predict(examples, id);

  for (size_t i = 0; i < examples.size(); i++) examples[i]->ft_offset = saved_offsets[i];
}